

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O0

void __thiscall VectorsTest_FP3Norm_Test::TestBody(VectorsTest_FP3Norm_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar;
  FP3 v;
  double *in_stack_ffffffffffffff80;
  Vector3<double> *this_01;
  AssertionResult *this_02;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  Type in_stack_ffffffffffffffac;
  AssertHelper *in_stack_ffffffffffffffb0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffd8;
  AssertHelper *in_stack_ffffffffffffffe0;
  
  this_01 = (Vector3<double> *)&stack0xffffffffffffffe0;
  pica::Vector3<double>::Vector3(this_01,2.0,3.0,6.0);
  pica::Vector3<double>::norm((Vector3<double> *)0x1e0290);
  this_02 = (AssertionResult *)&stack0xffffffffffffffd0;
  testing::internal::EqHelper<false>::Compare<double,double>
            ((char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),(char *)this_02,
             &this_01->x,in_stack_ffffffffffffff80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffb0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1e0314)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff9c,&this_02->success_);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffffe0,(Message *)in_stack_ffffffffffffffd8.ptr_);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x1e0362);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e03b2);
  return;
}

Assistant:

TEST(VectorsTest, FP3Norm)
{
    FP3 v(2, 3, 6);
    ASSERT_EQ(v.norm(), (FP)7);
}